

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

void __thiscall Population::applyMutation(Population *this)

{
  int iVar1;
  ParamType PVar2;
  
  CompoundMutation::getMutation(&this->mutationTree);
  iVar1 = (this->mutationTree).super_MutationComponent.productivity;
  this->health = (((this->mutationTree).super_MutationComponent.health + 100) * this->health) / 100;
  this->productivity = ((iVar1 + 100) * this->productivity) / 100;
  iVar1 = (this->mutationTree).super_MutationComponent.size;
  if (iVar1 == 1) {
    if ((int)this->size < 4) {
      PVar2 = this->size + SMALL;
      goto LAB_00125c04;
    }
  }
  else if ((iVar1 == -1) && (0 < (int)this->size)) {
    PVar2 = this->size - SMALL;
LAB_00125c04:
    this->size = PVar2;
  }
  iVar1 = (this->mutationTree).super_MutationComponent.safety;
  if (iVar1 == 1) {
    if ((int)this->safety < 4) {
      PVar2 = this->safety + SMALL;
      goto LAB_00125c29;
    }
  }
  else if ((iVar1 == -1) && (0 < (int)this->safety)) {
    PVar2 = this->safety - SMALL;
LAB_00125c29:
    this->safety = PVar2;
  }
  iVar1 = (this->mutationTree).super_MutationComponent.velocity;
  if (iVar1 == 1) {
    if (3 < (int)this->velocity) goto LAB_00125c5a;
    PVar2 = this->velocity + SMALL;
  }
  else {
    if ((iVar1 != -1) || ((int)this->velocity < 1)) goto LAB_00125c5a;
    PVar2 = this->velocity - SMALL;
  }
  this->velocity = PVar2;
LAB_00125c5a:
  iVar1 = (this->mutationTree).super_MutationComponent.cover;
  if (iVar1 == 1) {
    if (3 < (int)this->cover) {
      return;
    }
    PVar2 = this->cover + SMALL;
  }
  else {
    if (iVar1 != -1) {
      return;
    }
    if ((int)this->cover < 1) {
      return;
    }
    PVar2 = this->cover - SMALL;
  }
  this->cover = PVar2;
  return;
}

Assistant:

void Population::applyMutation() {
  mutationTree.getMutation();
  health *= (100 + mutationTree.health);
  productivity *= (100 + mutationTree.productivity);
  health /= 100;
  productivity /= 100;
  switchParam(size, mutationTree.size);
  switchParam(safety, mutationTree.safety);
  switchParam(velocity, mutationTree.velocity);
  switchParam(cover, mutationTree.cover);
}